

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaItemListAddSize(xmlSchemaItemListPtr list,int initialSize,void *item)

{
  int iVar1;
  void **ppvVar2;
  ulong uVar3;
  
  ppvVar2 = list->items;
  if (ppvVar2 == (void **)0x0) {
    uVar3 = 1;
    if (1 < initialSize) {
      uVar3 = (ulong)(uint)initialSize;
    }
    ppvVar2 = (void **)(*xmlMalloc)(uVar3 * 8);
    list->items = ppvVar2;
    if (ppvVar2 == (void **)0x0) {
      __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating new item list");
      return -1;
    }
    list->sizeItems = (int)uVar3;
  }
  else {
    iVar1 = list->sizeItems;
    if (iVar1 <= list->nbItems) {
      list->sizeItems = iVar1 * 2;
      ppvVar2 = (void **)(*xmlRealloc)(ppvVar2,(long)iVar1 << 4);
      list->items = ppvVar2;
      if (ppvVar2 == (void **)0x0) {
        __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"growing item list");
        list->sizeItems = 0;
        return -1;
      }
    }
  }
  iVar1 = list->nbItems;
  list->nbItems = iVar1 + 1;
  ppvVar2[iVar1] = item;
  return 0;
}

Assistant:

static int
xmlSchemaItemListAddSize(xmlSchemaItemListPtr list,
			 int initialSize,
			 void *item)
{
    if (list->items == NULL) {
	if (initialSize <= 0)
	    initialSize = 1;
	list->items = (void **) xmlMalloc(
	    initialSize * sizeof(void *));
	if (list->items == NULL) {
	    xmlSchemaPErrMemory(NULL, "allocating new item list", NULL);
	    return(-1);
	}
	list->sizeItems = initialSize;
    } else if (list->sizeItems <= list->nbItems) {
	list->sizeItems *= 2;
	list->items = (void **) xmlRealloc(list->items,
	    list->sizeItems * sizeof(void *));
	if (list->items == NULL) {
	    xmlSchemaPErrMemory(NULL, "growing item list", NULL);
	    list->sizeItems = 0;
	    return(-1);
	}
    }
    list->items[list->nbItems++] = item;
    return(0);
}